

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<float>_>::PrintGlobal
          (TPZFrontSym<std::complex<float>_> *this,char *name,ostream *out)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  poVar2 = std::operator<<(out,name);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar7 = 0; lVar7 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements;
      lVar7 = lVar7 + 1) {
    if ((this->super_TPZFront<std::complex<float>_>).fLocal.fStore[lVar7] != -1) {
      poVar2 = std::ostream::_M_insert<long>((long)out);
      std::operator<<(poVar2," ");
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  for (lVar7 = 0; lVar3 = (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements,
      lVar7 < lVar3; lVar7 = lVar7 + 1) {
    if ((this->super_TPZFront<std::complex<float>_>).fLocal.fStore[lVar7] != -1) {
      for (lVar6 = 0; lVar6 < lVar3; lVar6 = lVar6 + 1) {
        plVar1 = (this->super_TPZFront<std::complex<float>_>).fLocal.fStore;
        lVar4 = plVar1[lVar6];
        if (lVar4 != -1) {
          lVar3 = plVar1[lVar7];
          lVar5 = lVar4;
          if (lVar4 < lVar3) {
            lVar5 = lVar3;
          }
          if (lVar3 < lVar4) {
            lVar4 = lVar3;
          }
          poVar2 = std::operator<<(out,(complex *)
                                       ((this->super_TPZFront<std::complex<float>_>).fData.fStore +
                                       ((lVar5 + 1) * lVar5) / 2 + lVar4));
          std::operator<<(poVar2," ");
          lVar3 = (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements;
        }
      }
      std::endl<char,std::char_traits<char>>(out);
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void TPZFrontSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
}